

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

uint8_t __thiscall CPU::DEC(CPU *this,uint8_t argument)

{
  byte bVar1;
  
  bVar1 = argument - 1;
  this->field_0x2e = bVar1 >> 7 | (bVar1 == 0) << 6 | this->field_0x2e & 0xbe;
  return bVar1;
}

Assistant:

uint8_t CPU::DEC(uint8_t argument) {
	argument--;
	if (argument == 0) {
		Z = 1;
	} else {
		Z = 0;
	}
	if (argument & (1 << 7)) {
		N = 1;
	} else {
		N = 0;
	}
	return argument;
}